

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O2

_Bool ARM_rel_branch(cs_struct *h,uint id)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x34) break;
    lVar1 = lVar2 + 4;
  } while (*(uint *)((long)insn_rel + lVar2) != id);
  return lVar2 != 0x34;
}

Assistant:

bool ARM_rel_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_rel[i]; i++) {
		if (id == insn_rel[i]) {
			return true;
		}
	}

	// not found
	return false;
}